

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall spdlog::pattern_formatter::compile_pattern_(pattern_formatter *this,string *pattern)

{
  pointer puVar1;
  pointer puVar2;
  flag_formatter *pfVar3;
  aggregate_formatter *paVar4;
  pointer __p_1;
  pointer *__ptr_1;
  pointer unaff_RBP;
  pointer *__ptr;
  pointer puVar5;
  aggregate_formatter *paVar6;
  pointer __p;
  const_iterator end;
  padding_info pVar7;
  padding_info padding;
  padding_info padding_00;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  user_chars;
  aggregate_formatter *local_48;
  const_iterator local_40;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_38;
  
  end._M_current = (pattern->_M_dataplus)._M_p + pattern->_M_string_length;
  local_48 = (aggregate_formatter *)0x0;
  puVar1 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar5 = puVar1;
  if (puVar2 != puVar1) {
    do {
      pfVar3 = (puVar5->_M_t).
               super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
               ._M_t.
               super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
               .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl;
      if (pfVar3 != (flag_formatter *)0x0) {
        (*pfVar3->_vptr_flag_formatter[1])();
      }
      (puVar5->_M_t).
      super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ._M_t.
      super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
      .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl =
           (flag_formatter *)0x0;
      unaff_RBP = puVar5 + 1;
      puVar5 = unaff_RBP;
    } while (unaff_RBP != puVar2);
    (this->formatters_).
    super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  paVar6 = (aggregate_formatter *)(pattern->_M_dataplus)._M_p;
  paVar4 = local_48;
  while (local_48 = paVar4, local_40._M_current = (char *)paVar6,
        paVar6 != (aggregate_formatter *)end._M_current) {
    if (*(char *)&(paVar6->super_flag_formatter)._vptr_flag_formatter == '%') {
      if (paVar4 != (aggregate_formatter *)0x0) {
        local_48 = (aggregate_formatter *)0x0;
        local_38._M_head_impl = &paVar4->super_flag_formatter;
        std::
        vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
        ::
        emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                  ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                    *)&this->formatters_,
                   (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                    *)&local_38);
        if ((aggregate_formatter *)local_38._M_head_impl != (aggregate_formatter *)0x0) {
          (*((flag_formatter *)&(local_38._M_head_impl)->_vptr_flag_formatter)->_vptr_flag_formatter
            [1])();
        }
      }
      local_40._M_current = (char *)((long)&(paVar6->super_flag_formatter)._vptr_flag_formatter + 1)
      ;
      pVar7 = handle_padspec_(&local_40,end);
      if (local_40._M_current == end._M_current) break;
      unaff_RBP = (pointer)((ulong)unaff_RBP & 0xffff000000000000 | pVar7._8_8_ & 0xffffffffffff);
      if ((pVar7._8_8_ >> 0x28 & 1) == 0) {
        padding._8_8_ = unaff_RBP;
        padding.width_ = pVar7.width_;
        handle_flag_<spdlog::details::null_scoped_padder>(this,*local_40._M_current,padding);
      }
      else {
        padding_00._8_8_ = unaff_RBP;
        padding_00.width_ = pVar7.width_;
        handle_flag_<spdlog::details::scoped_padder>(this,*local_40._M_current,padding_00);
      }
    }
    else {
      if (paVar4 == (aggregate_formatter *)0x0) {
        local_48 = (aggregate_formatter *)operator_new(0x38);
        (local_48->super_flag_formatter)._vptr_flag_formatter = (_func_int **)0x0;
        (local_48->super_flag_formatter).padinfo_.width_ = 0;
        (local_48->super_flag_formatter).padinfo_.side_ = left;
        (local_48->super_flag_formatter).padinfo_.truncate_ = false;
        (local_48->super_flag_formatter).padinfo_.enabled_ = false;
        *(undefined2 *)&(local_48->super_flag_formatter).padinfo_.field_0xe = 0;
        (local_48->str_)._M_dataplus._M_p = (pointer)0x0;
        (local_48->str_)._M_string_length = 0;
        (local_48->str_).field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(local_48->str_).field_2 + 8) = 0;
        (local_48->super_flag_formatter)._vptr_flag_formatter =
             (_func_int **)&PTR__aggregate_formatter_0014a758;
        (local_48->str_)._M_dataplus._M_p = (pointer)&(local_48->str_).field_2;
        (local_48->str_)._M_string_length = 0;
        (local_48->str_).field_2._M_local_buf[0] = '\0';
        local_38._M_head_impl = (flag_formatter *)0x0;
      }
      std::__cxx11::string::push_back((char)local_48 + '\x18');
    }
    paVar4 = local_48;
    paVar6 = (aggregate_formatter *)(local_40._M_current + 1);
  }
  paVar6 = local_48;
  if (local_48 != (aggregate_formatter *)0x0) {
    local_48 = (aggregate_formatter *)0x0;
    local_40._M_current = (char *)paVar6;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    if ((aggregate_formatter *)local_40._M_current != (aggregate_formatter *)0x0) {
      (**(code **)(*(long *)local_40._M_current + 8))();
    }
  }
  if (local_48 != (aggregate_formatter *)0x0) {
    std::default_delete<spdlog::details::aggregate_formatter>::operator()
              ((default_delete<spdlog::details::aggregate_formatter> *)&local_48,local_48);
  }
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::compile_pattern_(const std::string &pattern)
{
    auto end = pattern.end();
    std::unique_ptr<details::aggregate_formatter> user_chars;
    formatters_.clear();
    for (auto it = pattern.begin(); it != end; ++it)
    {
        if (*it == '%')
        {
            if (user_chars) // append user chars found so far
            {
                formatters_.push_back(std::move(user_chars));
            }

            auto padding = handle_padspec_(++it, end);

            if (it != end)
            {
                if (padding.enabled())
                {
                    handle_flag_<details::scoped_padder>(*it, padding);
                }
                else
                {
                    handle_flag_<details::null_scoped_padder>(*it, padding);
                }
            }
            else
            {
                break;
            }
        }
        else // chars not following the % sign should be displayed as is
        {
            if (!user_chars)
            {
                user_chars = details::make_unique<details::aggregate_formatter>();
            }
            user_chars->add_ch(*it);
        }
    }
    if (user_chars) // append raw chars found so far
    {
        formatters_.push_back(std::move(user_chars));
    }
}